

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::BaseRAPass::insertPrologEpilog(BaseRAPass *this)

{
  BaseBuilder *pBVar1;
  FuncNode *pFVar2;
  Error EVar3;
  FuncFrame *frame;
  
  pBVar1 = (this->super_FuncPass).super_Pass._cb;
  pFVar2 = this->_func;
  pBVar1->_cursor = (BaseNode *)pFVar2;
  frame = &pFVar2->_frame;
  EVar3 = BaseEmitter::emitProlog(&pBVar1->super_BaseEmitter,frame);
  if (EVar3 == 0) {
    EVar3 = BaseEmitHelper::emitArgsAssignment(this->_iEmitHelper,frame,&this->_argsAssignment);
    if (EVar3 == 0) {
      pBVar1 = (this->super_FuncPass).super_Pass._cb;
      pBVar1->_cursor = &this->_func->_exitNode->super_BaseNode;
      EVar3 = BaseEmitter::emitEpilog(&pBVar1->super_BaseEmitter,frame);
    }
  }
  return EVar3;
}

Assistant:

Error BaseRAPass::insertPrologEpilog() noexcept {
  FuncFrame& frame = _func->frame();

  cc()->_setCursor(func());
  ASMJIT_PROPAGATE(cc()->emitProlog(frame));
  ASMJIT_PROPAGATE(_iEmitHelper->emitArgsAssignment(frame, _argsAssignment));

  cc()->_setCursor(func()->exitNode());
  ASMJIT_PROPAGATE(cc()->emitEpilog(frame));

  return kErrorOk;
}